

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# outdata_recv.c
# Opt level: O2

int mpt_outdata_recv(mpt_outdata *out)

{
  mpt_buffer *pmVar1;
  uint uVar2;
  void *pvVar3;
  ssize_t sVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  msghdr local_70;
  iovec vec;
  
  if ((out->sock)._id < 0) {
    uVar5 = 0xffffffff;
  }
  else if ((out->state & 0x10) == 0) {
    out->state = out->state & 0xcf;
    if (out->_idlen == '\0') {
      uVar7 = 0;
      lVar6 = 0x10000;
    }
    else {
      uVar7 = (uint)out->_smax;
      lVar6 = (ulong)out->_smax + 0x10000;
    }
    pvVar3 = (void *)mpt_array_slice(out,lVar6,0);
    uVar5 = 0xfffffffc;
    if (pvVar3 != (void *)0x0) {
      pmVar1 = (out->buf)._buf;
      local_70.msg_iov = (iovec *)&vec;
      vec.iov_len = pmVar1->_size;
      local_70.msg_name = (void *)0x0;
      local_70.msg_iovlen = 1;
      local_70.msg_flags = 0;
      local_70.msg_control = (void *)0x0;
      local_70.msg_controllen = 0;
      if (uVar7 != 0) {
        local_70.msg_name = (void *)((long)pvVar3 + 0x10000);
        vec.iov_len = vec.iov_len - uVar7;
      }
      local_70.msg_namelen = uVar7;
      vec.iov_base = pvVar3;
      sVar4 = recvmsg((out->sock)._id,&local_70,0);
      uVar2 = (uint)sVar4;
      if (-1 < (int)uVar2) {
        if (uVar2 < out->_idlen) {
          uVar5 = 0xfffffff0;
        }
        else {
          pmVar1->_used = (ulong)(uVar2 & 0x7fffffff);
          out->state = out->state | 0x20;
          out->_scurr = (uint8_t)local_70.msg_namelen;
          uVar5 = uVar7;
          if ((uint8_t)local_70.msg_namelen != '\0') {
            memmove((void *)((ulong)(uVar2 & 0x7fffffff) + (long)pvVar3),
                    (void *)((long)pvVar3 + 0x10000),(ulong)local_70.msg_namelen);
          }
        }
      }
    }
  }
  else {
    uVar5 = 0xffffffdf;
  }
  return uVar5;
}

Assistant:

extern int mpt_outdata_recv(MPT_STRUCT(outdata) *out)
{
	MPT_STRUCT(buffer) *buf;
	struct iovec vec;
	uint8_t *addr;
	struct msghdr mh;
	int len, max, post;
	
	if (!MPT_socket_active(&out->sock)) {
		return MPT_ERROR(BadArgument);
	}
	if (out->state & MPT_OUTFLAG(Active)) {
		return MPT_MESGERR(InProgress);
	}
	out->state &= ~MPT_OUTFLAG(Received);
	
	/* UDP maxsize buffer */
#define MPT_MAX_UDP_SIZE 0x10000
	max = MPT_MAX_UDP_SIZE;
	if ((post = out->_idlen)) {
		post = out->_smax;
		max += post;
	}
	if (!(addr = mpt_array_slice(&out->buf, max, 0))) {
		return MPT_ERROR(BadOperation);
	}
	buf = out->buf._buf;
	
	vec.iov_base = addr;
	vec.iov_len  = buf->_size;
	
	/* message default setup */
	mh.msg_name = 0;
	mh.msg_namelen = 0;
	mh.msg_iov = &vec;
	mh.msg_iovlen = 1;
	mh.msg_control = 0;
	mh.msg_controllen = 0;
	mh.msg_flags = 0;
	
	if ((mh.msg_namelen = post)) {
		mh.msg_name = addr + MPT_MAX_UDP_SIZE;
		vec.iov_len -= post;
	}
	/* get data from socket */
	if ((len = recvmsg(out->sock._id, &mh, 0)) < 0) {
		return MPT_ERROR(BadOperation);
	}
	if (len < out->_idlen) {
		return MPT_ERROR(MissingData);
	}
	buf->_used = len;
	out->state |= MPT_OUTFLAG(Received);
	
	if ((out->_scurr = mh.msg_namelen)) {
		memmove(addr + len, addr + MPT_MAX_UDP_SIZE, mh.msg_namelen);
	}
	
	return post;
}